

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O2

void HTS_Node_clear(HTS_Node *node)

{
  if (node->yes != (HTS_Node *)0x0) {
    HTS_Node_clear(node->yes);
    HTS_free(node->yes);
  }
  if (node->no != (HTS_Node *)0x0) {
    HTS_Node_clear(node->no);
    HTS_free(node->no);
  }
  node->index = 0;
  node->pdf = 0;
  node->yes = (_HTS_Node *)0x0;
  node->no = (_HTS_Node *)0x0;
  node->next = (_HTS_Node *)0x0;
  node->quest = (HTS_Question *)0x0;
  return;
}

Assistant:

static void HTS_Node_clear(HTS_Node * node)
{
   if (node->yes != NULL) {
      HTS_Node_clear(node->yes);
      HTS_free(node->yes);
   }
   if (node->no != NULL) {
      HTS_Node_clear(node->no);
      HTS_free(node->no);
   }
   HTS_Node_initialize(node);
}